

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

size_t green_poller_size(green_poller_t poller)

{
  char *pcVar1;
  undefined8 uVar2;
  
  if (poller == (green_poller_t)0x0) {
    return 0;
  }
  if (poller->loop == (green_loop_t)0x0) {
    pcVar1 = "poller->loop != ((void*)0)";
    uVar2 = 0x18c;
  }
  else if (poller->size < poller->used) {
    pcVar1 = "poller->size >= poller->used";
    uVar2 = 0x18d;
  }
  else {
    if (poller->busy <= poller->used) {
      return poller->size;
    }
    pcVar1 = "poller->used >= poller->busy";
    uVar2 = 0x18e;
  }
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

size_t green_poller_size(green_poller_t poller)
{
    if (poller == NULL) {
        return 0;
    }
    green_assert(poller->loop != NULL);
    green_assert(poller->size >= poller->used);
    green_assert(poller->used >= poller->busy);
    return poller->size;
}